

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdTree.c
# Opt level: O0

int Dsd_TreeGetAigCost_rec(Dsd_Node_t *pNode)

{
  int iVar1;
  int local_20;
  int local_1c;
  int Counter;
  int i;
  Dsd_Node_t *pNode_local;
  
  local_20 = 0;
  if (pNode == (Dsd_Node_t *)0x0) {
    __assert_fail("pNode",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bdd/dsd/dsdTree.c"
                  ,0x103,"int Dsd_TreeGetAigCost_rec(Dsd_Node_t *)");
  }
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Dsd_IsComplement( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bdd/dsd/dsdTree.c"
                  ,0x104,"int Dsd_TreeGetAigCost_rec(Dsd_Node_t *)");
  }
  if (pNode->nVisits < 0) {
    __assert_fail("pNode->nVisits >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bdd/dsd/dsdTree.c"
                  ,0x105,"int Dsd_TreeGetAigCost_rec(Dsd_Node_t *)");
  }
  if (pNode->nDecs < 2) {
    pNode_local._4_4_ = 0;
  }
  else {
    if (pNode->Type == DSD_NODE_OR) {
      local_20 = pNode->nDecs + -1;
    }
    else if (pNode->Type == DSD_NODE_EXOR) {
      local_20 = (pNode->nDecs + -1) * 3;
    }
    else if ((pNode->Type == DSD_NODE_PRIME) && (pNode->nDecs == 3)) {
      local_20 = 3;
    }
    for (local_1c = 0; local_1c < pNode->nDecs; local_1c = local_1c + 1) {
      iVar1 = Dsd_TreeGetAigCost_rec
                        ((Dsd_Node_t *)((ulong)pNode->pDecs[local_1c] & 0xfffffffffffffffe));
      local_20 = iVar1 + local_20;
    }
    pNode_local._4_4_ = local_20;
  }
  return pNode_local._4_4_;
}

Assistant:

int Dsd_TreeGetAigCost_rec( Dsd_Node_t * pNode )
{
    int i, Counter = 0;

    assert( pNode );
    assert( !Dsd_IsComplement( pNode ) );
    assert( pNode->nVisits >= 0 );

    if ( pNode->nDecs < 2 )
        return 0;

    // we don't want the two-input gates to count for non-decomposable blocks
    if ( pNode->Type == DSD_NODE_OR )
        Counter += pNode->nDecs - 1;
    else if ( pNode->Type == DSD_NODE_EXOR )
        Counter += 3*(pNode->nDecs - 1);
    else if ( pNode->Type == DSD_NODE_PRIME && pNode->nDecs == 3 )
        Counter += 3;

    // call recursively
    for ( i = 0; i < pNode->nDecs; i++ )
        Counter += Dsd_TreeGetAigCost_rec( Dsd_Regular(pNode->pDecs[i]) );
    return Counter;
}